

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O2

void __thiscall SQClosure::SetRoot(SQClosure *this,SQWeakRef *r)

{
  SQUnsignedInteger *pSVar1;
  SQWeakRef *pSVar2;
  
  pSVar2 = this->_root;
  if (pSVar2 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar2->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQRefCounted)._vptr_SQRefCounted[2])();
    }
  }
  this->_root = r;
  pSVar1 = &(r->super_SQRefCounted)._uiRef;
  *pSVar1 = *pSVar1 + 1;
  return;
}

Assistant:

void SetRoot(SQWeakRef *r)
    {
        __ObjRelease(_root);
        _root = r;
        __ObjAddRef(_root);
    }